

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O0

Reply * __thiscall
i2p::sam::Session::SendRequestAndGetReply
          (Session *this,Sock *sock,string *request,bool check_result_ok)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  runtime_error *this_00;
  long *in_RDX;
  long in_RSI;
  Reply *in_RDI;
  byte in_R8B;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_true>,_bool>
  pVar4;
  char **pos;
  Span<const_char> *kv;
  vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *__range2;
  Reply *reply;
  iterator __end2;
  iterator __begin2;
  Reply *in_stack_fffffffffffffcd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce0;
  undefined6 in_stack_fffffffffffffce8;
  undefined1 in_stack_fffffffffffffcee;
  undefined1 in_stack_fffffffffffffcef;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf0;
  undefined6 in_stack_fffffffffffffcf8;
  undefined1 in_stack_fffffffffffffcfe;
  byte bVar5;
  undefined1 in_stack_fffffffffffffcff;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
  in_stack_fffffffffffffd00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd18;
  Reply *in_stack_fffffffffffffd20;
  undefined7 in_stack_fffffffffffffd28;
  undefined1 in_stack_fffffffffffffd2f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd38;
  allocator<char> local_1d5;
  undefined1 local_1d4 [2];
  allocator<char> local_1d2;
  undefined1 local_1d1;
  char *local_1d0;
  Span<const_char> *local_1c8;
  undefined8 local_1c0;
  undefined8 local_190;
  allocator<char> local_181 [25];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
  local_168;
  undefined1 local_160;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
  local_158;
  undefined1 local_150;
  string local_148 [192];
  undefined1 local_88 [128];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::operator+(in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08);
  Span<char_const>::Span<std::__cxx11::string>
            ((Span<const_char> *)
             CONCAT17(in_stack_fffffffffffffcef,
                      CONCAT16(in_stack_fffffffffffffcee,in_stack_fffffffffffffce8)),
             in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<long,std::ratio<1l,1l>,void>
            ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffce0,
             (duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffcd8);
  (**(code **)(*in_RDX + 0x88))
            (in_RDX,local_181._9_8_,local_181._17_8_,local_181._1_8_,*(undefined8 *)(in_RSI + 0x78))
  ;
  std::__cxx11::string::~string(&in_stack_fffffffffffffcd8->full);
  Reply::Reply(in_stack_fffffffffffffcd8);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd00._M_cur,
             CONCAT17(in_stack_fffffffffffffcff,
                      CONCAT16(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcf8)),
             (size_type)in_stack_fffffffffffffcf0);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffffcef,
                                   CONCAT16(in_stack_fffffffffffffcee,in_stack_fffffffffffffce8)),
                          (char *)in_stack_fffffffffffffce0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
               (char *)in_stack_fffffffffffffd20,(allocator<char> *)in_stack_fffffffffffffd18);
  }
  else {
    std::__cxx11::string::string(&in_stack_fffffffffffffd20->full,in_stack_fffffffffffffd18);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffcef,
                      CONCAT16(in_stack_fffffffffffffcee,in_stack_fffffffffffffce8)),
             in_stack_fffffffffffffce0);
  std::__cxx11::string::~string(&in_stack_fffffffffffffcd8->full);
  if (bVar1) {
    std::allocator<char>::~allocator(local_181);
  }
  std::__cxx11::string::~string(&in_stack_fffffffffffffcd8->full);
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<long,std::ratio<60l,1l>,void>
            ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffce0,
             (duration<long,_std::ratio<60L,_1L>_> *)in_stack_fffffffffffffcd8);
  (**(code **)(*in_RDX + 0x90))(local_88,in_RDX,10,local_190,*(undefined8 *)(in_RSI + 0x78),0x10000)
  ;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
  std::__cxx11::string::~string(&in_stack_fffffffffffffcd8->full);
  Span<char_const>::Span<std::__cxx11::string>
            ((Span<const_char> *)
             CONCAT17(in_stack_fffffffffffffcef,
                      CONCAT16(in_stack_fffffffffffffcee,in_stack_fffffffffffffce8)),
             in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  util::Split<Span<char_const>>
            ((Span<const_char> *)
             CONCAT17(in_stack_fffffffffffffcef,
                      CONCAT16(in_stack_fffffffffffffcee,in_stack_fffffffffffffce8)),
             (char)((ulong)in_stack_fffffffffffffd08 >> 0x38));
  local_1c0 = std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::begin
                        ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
                         in_stack_fffffffffffffce0);
  local_1c8 = (Span<const_char> *)
              std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::end
                        ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
                         in_stack_fffffffffffffce0);
  while (bVar1 = __gnu_cxx::
                 operator==<Span<const_char>_*,_std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>_>
                           ((__normal_iterator<Span<const_char>_*,_std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>_>
                             *)CONCAT17(in_stack_fffffffffffffcef,
                                        CONCAT16(in_stack_fffffffffffffcee,in_stack_fffffffffffffce8
                                                )),
                            (__normal_iterator<Span<const_char>_*,_std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>_>
                             *)in_stack_fffffffffffffce0), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<Span<const_char>_*,_std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>_>
    ::operator*((__normal_iterator<Span<const_char>_*,_std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>_>
                 *)in_stack_fffffffffffffcd8);
    Span<const_char>::begin((Span<const_char> *)in_stack_fffffffffffffcd8);
    Span<const_char>::end((Span<const_char> *)in_stack_fffffffffffffcd8);
    local_1d1 = 0x3d;
    pcVar2 = std::find<char_const*,char>
                       ((char *)in_stack_fffffffffffffd08,(char *)in_stack_fffffffffffffd00._M_cur,
                        (char *)CONCAT17(in_stack_fffffffffffffcff,
                                         CONCAT16(in_stack_fffffffffffffcfe,
                                                  in_stack_fffffffffffffcf8)));
    local_1d0 = pcVar2;
    pcVar3 = Span<const_char>::end((Span<const_char> *)in_stack_fffffffffffffcd8);
    if (pcVar2 == pcVar3) {
      in_stack_fffffffffffffd08 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in_RDI->keys;
      in_stack_fffffffffffffd10 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           Span<const_char>::begin((Span<const_char> *)in_stack_fffffffffffffcd8);
      in_stack_fffffffffffffd18 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           Span<const_char>::end((Span<const_char> *)in_stack_fffffffffffffcd8);
      in_stack_fffffffffffffd20 = (Reply *)local_1d4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<char_const*,void>
                (in_stack_fffffffffffffd08,(char *)in_stack_fffffffffffffd00._M_cur,
                 (char *)CONCAT17(in_stack_fffffffffffffcff,
                                  CONCAT16(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcf8)),
                 (allocator<char> *)in_stack_fffffffffffffcf0);
      pVar4 = std::
              unordered_map<std::__cxx11::string,std::optional<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
              ::emplace<std::__cxx11::string,std::nullopt_t_const&>
                        ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)CONCAT17(in_stack_fffffffffffffcff,
                                     CONCAT16(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcf8)),
                         in_stack_fffffffffffffcf0,
                         (nullopt_t *)
                         CONCAT17(in_stack_fffffffffffffcef,
                                  CONCAT16(in_stack_fffffffffffffcee,in_stack_fffffffffffffce8)));
      in_stack_fffffffffffffd00._M_cur =
           (__node_type *)
           pVar4.first.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
           ._M_cur;
      in_stack_fffffffffffffcff = pVar4.second;
      local_168._M_cur = in_stack_fffffffffffffd00._M_cur;
      local_160 = in_stack_fffffffffffffcff;
      std::__cxx11::string::~string(&in_stack_fffffffffffffcd8->full);
      std::allocator<char>::~allocator((allocator<char> *)local_1d4);
    }
    else {
      Span<const_char>::begin((Span<const_char> *)in_stack_fffffffffffffcd8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<char_const*,void>
                (in_stack_fffffffffffffd08,(char *)in_stack_fffffffffffffd00._M_cur,
                 (char *)CONCAT17(in_stack_fffffffffffffcff,
                                  CONCAT16(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcf8)),
                 (allocator<char> *)in_stack_fffffffffffffcf0);
      Span<const_char>::end((Span<const_char> *)in_stack_fffffffffffffcd8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<char_const*,void>
                (in_stack_fffffffffffffd08,(char *)in_stack_fffffffffffffd00._M_cur,
                 (char *)CONCAT17(in_stack_fffffffffffffcff,
                                  CONCAT16(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcf8)),
                 (allocator<char> *)in_stack_fffffffffffffcf0);
      pVar4 = std::
              unordered_map<std::__cxx11::string,std::optional<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<std::__cxx11::string>>>>
              ::emplace<std::__cxx11::string,std::__cxx11::string>
                        ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)CONCAT17(in_stack_fffffffffffffcff,
                                     CONCAT16(in_stack_fffffffffffffcfe,in_stack_fffffffffffffcf8)),
                         in_stack_fffffffffffffcf0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffffcef,
                                  CONCAT16(in_stack_fffffffffffffcee,in_stack_fffffffffffffce8)));
      local_158._M_cur =
           (__node_type *)
           pVar4.first.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
           ._M_cur;
      in_stack_fffffffffffffd2f = pVar4.second;
      local_150 = in_stack_fffffffffffffd2f;
      std::__cxx11::string::~string(&in_stack_fffffffffffffcd8->full);
      std::allocator<char>::~allocator((allocator<char> *)(local_1d4 + 1));
      std::__cxx11::string::~string(&in_stack_fffffffffffffcd8->full);
      std::allocator<char>::~allocator(&local_1d2);
    }
    __gnu_cxx::
    __normal_iterator<Span<const_char>_*,_std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>_>
    ::operator++((__normal_iterator<Span<const_char>_*,_std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>_>
                  *)in_stack_fffffffffffffcd8);
  }
  std::vector<Span<const_char>,_std::allocator<Span<const_char>_>_>::~vector
            ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
             CONCAT17(in_stack_fffffffffffffcef,
                      CONCAT16(in_stack_fffffffffffffcee,in_stack_fffffffffffffce8)));
  bVar5 = 0;
  if ((in_R8B & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
               (char *)in_stack_fffffffffffffd20,(allocator<char> *)in_stack_fffffffffffffd18);
    Reply::Get(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffcef,
                                     CONCAT16(in_stack_fffffffffffffcee,in_stack_fffffffffffffce8)),
                            (char *)in_stack_fffffffffffffce0);
    bVar5 = bVar1 ^ 0xff;
    std::__cxx11::string::~string(&in_stack_fffffffffffffcd8->full);
    std::__cxx11::string::~string(&in_stack_fffffffffffffcd8->full);
    std::allocator<char>::~allocator(&local_1d5);
  }
  if ((bVar5 & 1) == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return in_RDI;
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              ((char *)in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,in_stack_fffffffffffffd08
              );
    std::runtime_error::runtime_error(this_00,local_148);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

Session::Reply Session::SendRequestAndGetReply(const Sock& sock,
                                               const std::string& request,
                                               bool check_result_ok) const
{
    sock.SendComplete(request + "\n", MAX_WAIT_FOR_IO, *m_interrupt);

    Reply reply;

    // Don't log the full "SESSION CREATE ..." because it contains our private key.
    reply.request = request.substr(0, 14) == "SESSION CREATE" ? "SESSION CREATE ..." : request;

    // It could take a few minutes for the I2P router to reply as it is querying the I2P network
    // (when doing name lookup, for example). Notice: `RecvUntilTerminator()` is checking
    // `m_interrupt` more often, so we would not be stuck here for long if `m_interrupt` is
    // signaled.
    static constexpr auto recv_timeout = 3min;

    reply.full = sock.RecvUntilTerminator('\n', recv_timeout, *m_interrupt, MAX_MSG_SIZE);

    for (const auto& kv : Split(reply.full, ' ')) {
        const auto& pos = std::find(kv.begin(), kv.end(), '=');
        if (pos != kv.end()) {
            reply.keys.emplace(std::string{kv.begin(), pos}, std::string{pos + 1, kv.end()});
        } else {
            reply.keys.emplace(std::string{kv.begin(), kv.end()}, std::nullopt);
        }
    }

    if (check_result_ok && reply.Get("RESULT") != "OK") {
        throw std::runtime_error(
            strprintf("Unexpected reply to \"%s\": \"%s\"", request, reply.full));
    }

    return reply;
}